

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int op;
  size_t opsz;
  int local_14;
  long local_10;
  
  iVar1 = nn_socket(1,0x10);
  if (iVar1 != -1) {
    local_10 = 4;
    iVar2 = nn_getsockopt(iVar1,0,0xc,&local_14);
    if (iVar2 == 0) {
      if (local_10 != 4) goto LAB_0010153e;
      if (local_14 != 1) goto LAB_00101543;
      local_10 = 4;
      iVar2 = nn_getsockopt(iVar1,0,0xd,&local_14);
      if (iVar2 != 0) goto LAB_00101548;
      if (local_10 != 4) goto LAB_0010154d;
      if (local_14 == 0x10) {
        iVar1 = nn_close(iVar1);
        if (iVar1 == 0) {
          return 0;
        }
        piVar3 = __errno_location();
        if (*piVar3 == 9) {
          return 0;
        }
        if (*piVar3 == 0x9523dfd) {
          return 0;
        }
        goto LAB_0010155c;
      }
    }
    else {
      main_cold_1();
LAB_0010153e:
      main_cold_2();
LAB_00101543:
      main_cold_3();
LAB_00101548:
      main_cold_4();
LAB_0010154d:
      main_cold_5();
    }
    main_cold_6();
  }
  main_cold_8();
LAB_0010155c:
  main_cold_7();
}

Assistant:

int main ()
{
    int rc;
    int s;
    int op;
    size_t opsz;

    s = test_socket (AF_SP, NN_PAIR);

    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    errno_assert (rc == 0);
    nn_assert (opsz == sizeof (op));
    nn_assert (op == AF_SP);

    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_PROTOCOL, &op, &opsz);
    errno_assert (rc == 0);
    nn_assert (opsz == sizeof (op));
    nn_assert (op == NN_PAIR);

    test_close (s);

    return 0;
}